

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64.c
# Opt level: O3

_Bool roaring64_bitmap_iterate(roaring64_bitmap_t *r,roaring_iterator64 iterator,void *ptr)

{
  _Bool _Var1;
  ulong uVar2;
  uint base;
  ulong uVar3;
  array_container_t *cont;
  art_iterator_t it;
  art_iterator_t local_c0;
  
  art_init_iterator(&local_c0,&r->art,true);
  if (local_c0.value != (ulong *)0x0) {
    do {
      uVar2 = *local_c0.value;
      cont = (array_container_t *)r->containers[uVar2 >> 8];
      if ((char)uVar2 == '\x04') {
        uVar2 = (ulong)*(byte *)&cont->array;
        cont = *(array_container_t **)cont;
      }
      uVar3 = (ulong)CONCAT24(local_c0.key._4_2_,local_c0.key._0_4_);
      base = (uint)(((ulong)(ushort)local_c0.key._4_2_ << 0x20) >> 0x18) & 0xff0000 |
             (uint)(((ulong)(ushort)local_c0.key._4_2_ << 0x20) >> 8);
      uVar3 = (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
              uVar3 << 0x38;
      if ((char)uVar2 == '\x01') {
        _Var1 = bitset_container_iterate64((bitset_container_t *)cont,base,iterator,uVar3,ptr);
      }
      else if (((uint)uVar2 & 0xff) == 3) {
        _Var1 = run_container_iterate64((run_container_t *)cont,base,iterator,uVar3,ptr);
      }
      else {
        _Var1 = array_container_iterate64(cont,base,iterator,uVar3,ptr);
      }
      if (_Var1 == false) {
        return false;
      }
      art_iterator_next(&local_c0);
    } while (local_c0.value != (ulong *)0x0);
  }
  return true;
}

Assistant:

bool roaring64_bitmap_iterate(const roaring64_bitmap_t *r,
                              roaring_iterator64 iterator, void *ptr) {
    art_iterator_t it = art_init_iterator((art_t *)&r->art, /*first=*/true);
    while (it.value != NULL) {
        uint64_t high48 = combine_key(it.key, 0);
        uint64_t high32 = high48 & 0xFFFFFFFF00000000ULL;
        uint32_t low32 = high48;
        leaf_t leaf = (leaf_t)*it.value;
        if (!container_iterate64(get_container(r, leaf), get_typecode(leaf),
                                 low32, iterator, high32, ptr)) {
            return false;
        }
        art_iterator_next(&it);
    }
    return true;
}